

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaModelGroupDefPtr
xmlSchemaParseModelGroupDefinition(xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node)

{
  xmlChar *refTargetNs;
  _xmlAttr *p_Var1;
  int iVar2;
  xmlAttrPtr ownerItem;
  xmlSchemaTypePtr attr;
  undefined4 extraout_var;
  xmlSchemaModelGroupDefPtr extraout_RAX;
  undefined8 *item;
  xmlSchemaRedefPtr_conflict pxVar3;
  undefined4 extraout_var_00;
  xmlSchemaModelGroupDefPtr pxVar4;
  xmlSchemaModelGroupDefPtr extraout_RAX_00;
  xmlSchemaModelGroupDefPtr extraout_RAX_01;
  xmlSchemaTypeType type;
  xmlNodePtr in_RCX;
  xmlSchemaTypePtr type_00;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr pxVar5;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlChar **in_R8;
  char *in_R9;
  _xmlNode *node_00;
  xmlChar *name;
  char *in_stack_ffffffffffffffb8;
  xmlSchemaTypePtr local_38;
  
  ownerItem = xmlSchemaGetPropNode(node,"name");
  if (ownerItem == (xmlAttrPtr)0x0) {
    xmlSchemaPMissingAttrErr
              (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1ef6d9,in_RCX,(char *)in_R8,in_R9
              );
    return extraout_RAX;
  }
  attr = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
  type_00 = (xmlSchemaTypePtr)&local_38;
  iVar2 = xmlSchemaPValAttrNode
                    (ctxt,(xmlSchemaBasicItemPtr)ownerItem,(xmlAttrPtr)attr,type_00,in_R8);
  if (iVar2 != 0) {
    return (xmlSchemaModelGroupDefPtr)CONCAT44(extraout_var,iVar2);
  }
  if (local_38 == (xmlSchemaTypePtr)0x0) {
    return (xmlSchemaModelGroupDefPtr)CONCAT44(extraout_var,iVar2);
  }
  refTargetNs = ctxt->targetNamespace;
  item = (undefined8 *)(*xmlMalloc)(0x40);
  if (item == (undefined8 *)0x0) {
    ctxt->nberrors = ctxt->nberrors + 1;
    __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"adding group");
    return extraout_RAX_01;
  }
  item[4] = 0;
  item[5] = 0;
  *item = 0;
  item[1] = 0;
  item[6] = 0;
  item[7] = 0;
  item[2] = 0;
  item[3] = 0;
  item[4] = local_38;
  *(undefined4 *)item = 0x11;
  item[6] = node;
  item[5] = refTargetNs;
  if (ctxt->isRedefine != 0) {
    pxVar3 = xmlSchemaAddRedef(ctxt,ctxt->redefined,item,(xmlChar *)local_38,refTargetNs);
    ctxt->redef = pxVar3;
    if (pxVar3 == (xmlSchemaRedefPtr_conflict)0x0) {
      pxVar4 = (xmlSchemaModelGroupDefPtr)(*xmlFree)(item);
      return pxVar4;
    }
    ctxt->redefCounter = 0;
    type_00 = local_38;
  }
  xmlSchemaAddItemSize(&ctxt->constructor->bucket->globals,5,item);
  xmlSchemaAddItemSize(&ctxt->constructor->pending,10,item);
  pxVar5 = extraout_RDX;
  for (p_Var1 = node->properties; p_Var1 != (_xmlAttr *)0x0; p_Var1 = p_Var1->next) {
    if (p_Var1->ns == (xmlNs *)0x0) {
      iVar2 = xmlStrEqual(p_Var1->name,"name");
      pxVar5 = extraout_RDX_02;
      if ((iVar2 == 0) &&
         (iVar2 = xmlStrEqual(p_Var1->name,"id"), pxVar5 = extraout_RDX_03, iVar2 == 0))
      goto LAB_001b547f;
    }
    else {
      iVar2 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      pxVar5 = extraout_RDX_00;
      if (iVar2 != 0) {
LAB_001b547f:
        xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var1,pxVar5,(xmlAttrPtr)type_00);
        pxVar5 = extraout_RDX_01;
      }
    }
  }
  iVar2 = xmlSchemaPValAttrID(ctxt,node,(xmlChar *)pxVar5);
  node_00 = node->children;
  if (node_00 == (xmlNodePtr)0x0) {
    return (xmlSchemaModelGroupDefPtr)CONCAT44(extraout_var_00,iVar2);
  }
  if (((node_00->ns != (xmlNs *)0x0) &&
      (iVar2 = xmlStrEqual(node_00->name,"annotation"), iVar2 != 0)) &&
     (iVar2 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
     iVar2 != 0)) {
    pxVar4 = (xmlSchemaModelGroupDefPtr)xmlSchemaParseAnnotation(ctxt,node_00,1);
    item[1] = pxVar4;
    node_00 = node_00->next;
    if (node_00 == (_xmlNode *)0x0) {
      return pxVar4;
    }
  }
  if (node_00->ns == (xmlNs *)0x0) goto LAB_001b55fe;
  iVar2 = xmlStrEqual(node_00->name,"all");
  if (iVar2 == 0) {
LAB_001b5567:
    if (node_00->ns == (xmlNs *)0x0) goto LAB_001b55fe;
    iVar2 = xmlStrEqual(node_00->name,(xmlChar *)"choice");
    if (iVar2 != 0) {
      iVar2 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      type = XML_SCHEMA_TYPE_CHOICE;
      if (iVar2 != 0) goto LAB_001b55db;
    }
    if ((node_00->ns == (xmlNs *)0x0) || (iVar2 = xmlStrEqual(node_00->name,"sequence"), iVar2 == 0)
       ) goto LAB_001b55fe;
    iVar2 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
    type = XML_SCHEMA_TYPE_SEQUENCE;
    if (iVar2 == 0) goto LAB_001b55fe;
  }
  else {
    iVar2 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
    type = XML_SCHEMA_TYPE_ALL;
    if (iVar2 == 0) goto LAB_001b5567;
  }
LAB_001b55db:
  pxVar4 = (xmlSchemaModelGroupDefPtr)xmlSchemaParseModelGroup(ctxt,schema,node_00,type,0);
  item[3] = pxVar4;
  node_00 = node_00->next;
  if (node_00 == (_xmlNode *)0x0) {
    return pxVar4;
  }
LAB_001b55fe:
  xmlSchemaPContentErr
            (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,node_00,
             (xmlNodePtr)0x0,"(annotation?, (all | choice | sequence)?)",in_stack_ffffffffffffffb8);
  return extraout_RAX_00;
}

Assistant:

static xmlSchemaModelGroupDefPtr
xmlSchemaParseModelGroupDefinition(xmlSchemaParserCtxtPtr ctxt,
				   xmlSchemaPtr schema,
				   xmlNodePtr node)
{
    xmlSchemaModelGroupDefPtr item;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    const xmlChar *name;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    attr = xmlSchemaGetPropNode(node, "name");
    if (attr == NULL) {
	xmlSchemaPMissingAttrErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_MISSING,
	    NULL, node,
	    "name", NULL);
	return (NULL);
    } else if (xmlSchemaPValAttrNode(ctxt, NULL, attr,
	xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0) {
	return (NULL);
    }
    item = xmlSchemaAddModelGroupDefinition(ctxt, schema, name,
	ctxt->targetNamespace, node);
    if (item == NULL)
	return (NULL);
    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "id"))) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
	item->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
	child = child->next;
    }
    if (IS_SCHEMA(child, "all")) {
	item->children = xmlSchemaParseModelGroup(ctxt, schema, child,
	    XML_SCHEMA_TYPE_ALL, 0);
	child = child->next;
    } else if (IS_SCHEMA(child, "choice")) {
	item->children = xmlSchemaParseModelGroup(ctxt, schema, child,
	    XML_SCHEMA_TYPE_CHOICE, 0);
	child = child->next;
    } else if (IS_SCHEMA(child, "sequence")) {
	item->children = xmlSchemaParseModelGroup(ctxt, schema, child,
	    XML_SCHEMA_TYPE_SEQUENCE, 0);
	child = child->next;
    }



    if (child != NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child, NULL,
	    "(annotation?, (all | choice | sequence)?)");
    }
    return (item);
}